

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O1

time_t Convert(time_t Month,time_t Day,time_t Year,time_t Hours,time_t Minutes,time_t Seconds,
              time_t Timezone,DSTMODE DSTmode)

{
  long lVar1;
  tm *ptVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  time_t local_10;
  
  uVar4 = Year + 0x76c;
  if (99 < Year) {
    uVar4 = Year;
  }
  if (Year < 0x45) {
    uVar4 = Year + 2000;
  }
  Convert::DaysInMonth[1] = 0x1c;
  if ((uVar4 & 3) == 0) {
    lVar1 = uVar4 * -0x70a3d70a3d70a3d7;
    Convert::DaysInMonth[1] = 0x1d;
    if ((lVar1 + 0x51eb851eb851eb8U >> 2 | lVar1 << 0x3e) < 0x28f5c28f5c28f5d) {
      Convert::DaysInMonth[1] =
           ((lVar1 + 0x51eb851eb851eb0U >> 4 | lVar1 << 0x3c) < 0xa3d70a3d70a3d7) + 0x1c;
    }
  }
  local_10 = -1;
  if (((((0 < Day) && (0xfffffffffffffff3 < Month - 0xdU)) && (0xffffffffffffffba < uVar4 - 0x7f7))
      && (((ulong)Seconds < 0x3c && ((ulong)Minutes < 0x3c)))) && ((ulong)Hours < 0x18)) {
    uVar3 = Month - 1;
    piVar5 = Convert::DaysInMonth;
    if (Day <= Convert::DaysInMonth[uVar3 & 0xffffffff]) {
      lVar1 = Day + -1;
      if (1 < Month) {
        do {
          lVar1 = lVar1 + *piVar5;
          piVar5 = piVar5 + 1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      if (0x7b2 < (long)uVar4) {
        uVar3 = 0x7b2;
        do {
          lVar1 = lVar1 + 0x16d + (ulong)((uVar3 & 3) == 0);
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      local_10 = Minutes * 0x3c + Hours * 0xe10 + Seconds + Timezone + lVar1 * 0x15180;
      if ((DSTmode == DSTon) ||
         ((DSTmode == DSTmaybe && (ptVar2 = localtime(&local_10), ptVar2->tm_isdst != 0)))) {
        local_10 = local_10 + -0xe10;
      }
    }
  }
  return local_10;
}

Assistant:

static time_t
Convert(time_t Month, time_t Day, time_t Year,
	time_t Hours, time_t Minutes, time_t Seconds,
	time_t Timezone, enum DSTMODE DSTmode)
{
	static int DaysInMonth[12] = {
		31, 0, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31
	};
	time_t	Julian;
	int	i;

	if (Year < 69)
		Year += 2000;
	else if (Year < 100)
		Year += 1900;
	DaysInMonth[1] = Year % 4 == 0 && (Year % 100 != 0 || Year % 400 == 0)
	    ? 29 : 28;
	/* Checking for 2038 bogusly assumes that time_t is 32 bits.  But
	   I'm too lazy to try to check for time_t overflow in another way.  */
	if (Year < EPOCH || Year > 2038
	    || Month < 1 || Month > 12
	    /* Lint fluff:  "conversion from long may lose accuracy" */
	    || Day < 1 || Day > DaysInMonth[(int)--Month]
	    || Hours < 0 || Hours > 23
	    || Minutes < 0 || Minutes > 59
	    || Seconds < 0 || Seconds > 59)
		return -1;

	Julian = Day - 1;
	for (i = 0; i < Month; i++)
		Julian += DaysInMonth[i];
	for (i = EPOCH; i < Year; i++)
		Julian += 365 + (i % 4 == 0);
	Julian *= DAY;
	Julian += Timezone;
	Julian += Hours * HOUR + Minutes * MINUTE + Seconds;
	if (DSTmode == DSTon
	    || (DSTmode == DSTmaybe && localtime(&Julian)->tm_isdst))
		Julian -= HOUR;
	return Julian;
}